

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

void lj_tab_clear(GCtab *t)

{
  undefined4 *puVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  long lVar4;
  
  if ((ulong)t->asize != 0) {
    memset((void *)(t->array).ptr64,0xff,(ulong)t->asize << 3);
  }
  uVar2 = t->hmask;
  if (uVar2 != 0) {
    uVar3 = (t->node).ptr64;
    (t->freetop).ptr64 = uVar3 + (ulong)(uVar2 + 1) * 0x18;
    lVar4 = 0;
    do {
      *(undefined8 *)(uVar3 + 0x10 + lVar4) = 0;
      puVar1 = (undefined4 *)(uVar3 + lVar4);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      lVar4 = lVar4 + 0x18;
    } while ((ulong)(uVar2 + 1 + (uint)(uVar2 + 1 == 0)) * 0x18 != lVar4);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_tab_clear(GCtab *t)
{
  clearapart(t);
  if (t->hmask > 0) {
    Node *node = noderef(t->node);
    setfreetop(t, node, &node[t->hmask+1]);
    clearhpart(t);
  }
}